

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlator.cc
# Opt level: O2

int decoder::correlate(uint8_t *data,size_t len,int *maxOut,correlationType *maxType)

{
  correlationType cVar1;
  uint uVar2;
  correlationType cVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  uint j;
  long lVar8;
  int local_48 [8];
  int max [4];
  int pos [4];
  
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[6] = 0;
  local_48[7] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  uVar6 = 0;
  for (uVar2 = 0; uVar2 < len; uVar2 = uVar2 + 1) {
    uVar6 = (uint)(data[uVar2] >> 7) + uVar6 * 2;
    if (0x3e < uVar2) {
      puVar7 = &(anonymous_namespace)::encodedSyncWords;
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        uVar4 = (*puVar7 ^ uVar6) - ((*puVar7 ^ uVar6) >> 1 & 0x55555555);
        uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
        iVar5 = 0x40 - (((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18);
        if (local_48[lVar8] < iVar5) {
          local_48[lVar8] = iVar5;
          local_48[lVar8 + 4] = uVar2 - 0x3f;
        }
        puVar7 = puVar7 + 2;
      }
    }
  }
  cVar3 = LRIT_PHASE_000;
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    cVar1 = (correlationType)lVar8;
    if (local_48[lVar8] <= local_48[(int)cVar3]) {
      cVar1 = cVar3;
    }
    cVar3 = cVar1;
  }
  if (maxOut != (int *)0x0) {
    *maxOut = local_48[(int)cVar3];
  }
  if (maxType != (correlationType *)0x0) {
    *maxType = cVar3;
  }
  return local_48[(long)(int)cVar3 + 4];
}

Assistant:

int correlate(uint8_t* data, size_t len, int* maxOut, correlationType* maxType) {
  uint64_t tmp = 0;

  // Position with maximum correlation
  int pos[4] = { 0, 0, 0, 0 };

  // Maximum correlation
  int max[4] = { 0, 0, 0, 0 };

  // Find maximum correlation
  for (unsigned i = 0; i < len; i++) {
    // If data >= 128 (i.e. MSB == 1), set bit in stream.
    tmp = (tmp << 1) | (data[i] & 0x80) >> 7;
    if (i < (encodedSyncWordBits - 1)) {
      continue;
    }

    // Match tmp against encoded sync words
    for (unsigned j = 0; j < 4; j++) {
      auto v = 64 - __builtin_popcount(tmp ^ encodedSyncWords[j]);
      if (v > max[j]) {
        max[j] = v;
        pos[j] = i - (encodedSyncWordBits - 1);
      }
    }
  }

  // Return position for best correlating sync word
  int j = 0;
  for (unsigned i = 0; i < 4; i++) {
    if (max[i] > max[j]) {
      j = i;
    }
  }

  if (maxOut != nullptr) {
    *maxOut = max[j];
  }
  if (maxType != nullptr) {
    *maxType = static_cast<correlationType>(j);
  }
  return pos[j];
}